

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O0

int t3_compare_case_fold_min(utf8_ptr *a,size_t *alen,wchar_t **b,size_t *blen)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  wchar_t *pwVar6;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  utf8_ptr *in_RDI;
  bool bVar7;
  size_t ainc;
  wchar_t bch;
  wchar_t ach;
  CVmCaseFoldStr bp;
  Utf8FoldStr ap;
  wchar_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  Utf8FoldStr *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  CVmCaseFoldStr local_78;
  Utf8FoldStr local_50;
  long *local_28;
  long *local_20;
  long *local_18;
  utf8_ptr *local_10;
  int local_4;
  
  if ((*in_RSI == 0) || (*in_RCX == 0)) {
    local_4 = (int)*in_RSI - (int)*in_RCX;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    utf8_ptr::getptr(in_RDI);
    Utf8FoldStr::Utf8FoldStr
              ((Utf8FoldStr *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)in_stack_ffffffffffffff78,
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    CVmCaseFoldStr::CVmCaseFoldStr
              ((CVmCaseFoldStr *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,0x29a188);
    do {
      wVar1 = Utf8FoldStr::getch(in_stack_ffffffffffffff78);
      wVar2 = CVmCaseFoldStr::getch((CVmCaseFoldStr *)in_stack_ffffffffffffff78);
      if (wVar1 != wVar2) {
        return wVar1 - wVar2;
      }
      iVar3 = Utf8FoldStr::at_boundary(&local_50);
      bVar7 = true;
      if (iVar3 != 0) {
        iVar3 = CVmCaseFoldStr::at_boundary(&local_78);
        bVar7 = iVar3 == 0;
      }
    } while (bVar7);
    pcVar4 = Utf8FoldStr::getptr((Utf8FoldStr *)0x29a203);
    pcVar5 = utf8_ptr::getptr(local_10);
    *local_18 = *local_18 - ((long)pcVar4 - (long)pcVar5);
    utf8_ptr::inc_bytes(local_10,(long)pcVar4 - (long)pcVar5);
    pwVar6 = CVmCaseFoldStr::getptr(&local_78);
    *local_28 = *local_28 - ((long)pwVar6 - *local_20 >> 2);
    pwVar6 = CVmCaseFoldStr::getptr(&local_78);
    *local_20 = (long)pwVar6;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int t3_compare_case_fold_min(
    utf8_ptr &a, size_t &alen, const wchar_t *&b, size_t &blen)
{
    /* if either is empty, there can be no match (unless both are empty) */
    if (alen == 0 || blen == 0)
        return alen - blen;

    /* set up folded-case string readers for the two strings */
    Utf8FoldStr ap(a.getptr(), alen);
    CVmCaseFoldStr bp(b, blen);

    /* 
     *   Scan until we're at a boundary in both strings.  Note that we start
     *   at a boundary, so always compare at least one character. 
     */
    do
    {
        /* get the next character of each string */
        wchar_t ach = ap.getch(), bch = bp.getch();

        /* if they're different, return the sign difference */
        if (ach != bch)
            return ach - bch;
    }
    while (!ap.at_boundary() || !bp.at_boundary());

    /* 
     *   If we made it to a boundary in each string without finding a
     *   difference, we have a match.  Advance each string past the matched
     *   text.
     */
    size_t ainc = ap.getptr() - a.getptr();
    alen -= ainc;
    a.inc_bytes(ainc);

    blen -= bp.getptr() - b;
    b = bp.getptr();

    /* return "equal" */
    return 0;
}